

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::EnumDescriptorProto::_InternalParse
          (EnumDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  string *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_00;
  EnumOptions *msg;
  EnumDescriptorProto_EnumReservedRange *msg_00;
  EnumValueDescriptorProto *msg_01;
  char cVar2;
  uint32 tag;
  char *local_50;
  uint local_44;
  EnumDescriptorProto *local_40;
  InternalMetadataWithArena *local_38;
  
  local_38 = &this->_internal_metadata_;
  local_50 = ptr;
  local_40 = this;
LAB_002b7d4e:
  do {
    bVar1 = internal::ParseContext::Done(ctx,&local_50);
    if (bVar1) {
      return local_50;
    }
    local_50 = internal::ReadTag(local_50,&local_44,0);
    if (local_50 == (char *)0x0) {
      return (char *)0x0;
    }
    cVar2 = (char)local_44;
    switch(local_44 >> 3) {
    case 1:
      if (cVar2 != '\n') break;
      s = _internal_mutable_name_abi_cxx11_(local_40);
      local_50 = internal::InlineGreedyStringParser(s,local_50,ctx);
      goto LAB_002b7eef;
    case 2:
      if (cVar2 == '\x12') {
        local_50 = local_50 + -1;
        do {
          local_50 = local_50 + 1;
          msg_01 = RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::Add(&this->value_);
          local_50 = internal::ParseContext::
                     ParseMessage<google::protobuf::EnumValueDescriptorProto>(ctx,msg_01,local_50);
          if (local_50 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_50 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_50 == '\x12'));
        goto LAB_002b7d4e;
      }
      break;
    case 3:
      if (cVar2 == '\x1a') {
        msg = _internal_mutable_options(local_40);
        local_50 = internal::ParseContext::ParseMessage<google::protobuf::EnumOptions>
                             (ctx,msg,local_50);
        goto LAB_002b7eef;
      }
      break;
    case 4:
      if (cVar2 == '\"') {
        local_50 = local_50 + -1;
        do {
          local_50 = local_50 + 1;
          msg_00 = RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange>::Add
                             (&this->reserved_range_);
          local_50 = internal::ParseContext::
                     ParseMessage<google::protobuf::EnumDescriptorProto_EnumReservedRange>
                               (ctx,msg_00,local_50);
          if (local_50 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_50 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_50 == '\"'));
        goto LAB_002b7d4e;
      }
      break;
    case 5:
      if (cVar2 == '*') {
        local_50 = local_50 + -1;
        do {
          local_50 = local_50 + 1;
          s_00 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::Add(&this->reserved_name_);
          local_50 = internal::InlineGreedyStringParser(s_00,local_50,ctx);
          if (local_50 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_50 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_50 == '*'));
        goto LAB_002b7d4e;
      }
    }
    if ((local_44 == 0) || ((local_44 & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_44 - 1;
      return local_50;
    }
    local_50 = internal::UnknownFieldParse(local_44,local_38,local_50,ctx);
LAB_002b7eef:
    if (local_50 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* EnumDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.EnumDescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.EnumValueDescriptorProto value = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_value(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.EnumOptions options = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.EnumDescriptorProto.EnumReservedRange reserved_range = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_reserved_range(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<34>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated string reserved_name = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_reserved_name(), ptr, ctx, "google.protobuf.EnumDescriptorProto.reserved_name");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<42>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}